

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::CompactReporter::noMatchingTestCases(CompactReporter *this,string *spec)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)
                           (this->super_StreamingReporterBase<Catch::CompactReporter>).stream,
                           "No test cases matched \'");
  poVar1 = std::operator<<(poVar1,(string *)spec);
  poVar1 = std::operator<<(poVar1,'\'');
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void CompactReporter::noMatchingTestCases( std::string const& spec ) {
            stream << "No test cases matched '" << spec << '\'' << std::endl;
        }